

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

void traverse_hplane_fast_colmajor<PredictionData<double,long>,long>
               (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplane,ExtIsoForest *model_outputs,
               PredictionData<double,_long> *prediction_data,double *output_depth,long *tree_num,
               double *tree_depth,size_t row)

{
  double dVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  double *in_RCX;
  long *in_RDX;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *in_RDI;
  long in_R8;
  double *in_R9;
  long in_stack_00000008;
  size_t col;
  double hval;
  size_t curr_lev;
  size_t local_80;
  ulong local_48;
  double local_40;
  size_type local_38;
  
  local_38 = 0;
  while( true ) {
    pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    if (pvVar5->hplane_left == 0) break;
    local_40 = 0.0;
    local_48 = 0;
    while( true ) {
      pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pvVar5->col_num);
      lVar4 = in_stack_00000008;
      if (sVar6 <= local_48) break;
      lVar3 = *in_RDX;
      pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&pvVar5->col_num,local_48);
      dVar1 = *(double *)(lVar3 + (lVar4 + *pvVar7 * in_RDX[2]) * 8);
      pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&pvVar5->mean,local_48);
      dVar2 = *pvVar8;
      pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&pvVar5->coef,local_48);
      local_40 = (dVar1 - dVar2) * *pvVar8 + local_40;
      local_48 = local_48 + 1;
    }
    pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    if (pvVar5->split_point < local_40) {
      pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      local_80 = pvVar5->hplane_right;
    }
    else {
      pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
      local_80 = pvVar5->hplane_left;
    }
    local_38 = local_80;
  }
  pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
  *in_RCX = pvVar5->score + *in_RCX;
  if (in_R8 != 0) {
    *(size_type *)(in_R8 + in_stack_00000008 * 8) = local_38;
  }
  if (in_R9 != (double *)0x0) {
    pvVar5 = std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::operator[](in_RDI,local_38);
    *in_R9 = pvVar5->score;
  }
  return;
}

Assistant:

void traverse_hplane_fast_colmajor(std::vector<IsoHPlane>  &hplane,
                                   ExtIsoForest            &model_outputs,
                                   PredictionData          &prediction_data,
                                   double &restrict        output_depth,
                                   sparse_ix *restrict     tree_num,
                                   double *restrict        tree_depth,
                                   size_t                  row) noexcept
{
    size_t  curr_lev = 0;
    double  hval;

    while(true)
    {
        // if (hplane[curr_lev].score > 0)
        if (unlikely(hplane[curr_lev].hplane_left == 0))
        {
            output_depth += hplane[curr_lev].score;
            if (unlikely(tree_num != NULL))
                tree_num[row] = curr_lev;
            if (unlikely(tree_depth != NULL))
                *tree_depth = hplane[curr_lev].score;
            return;
        }

        else
        {
            hval = 0;
            for (size_t col = 0; col < hplane[curr_lev].col_num.size(); col++)
                hval += (prediction_data.numeric_data[row +  hplane[curr_lev].col_num[col] * prediction_data.nrows] 
                         - hplane[curr_lev].mean[col]) * hplane[curr_lev].coef[col];

            curr_lev  = (hval <= hplane[curr_lev].split_point)?
                         hplane[curr_lev].hplane_left : hplane[curr_lev].hplane_right;

        }
    }
}